

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgrenderstate.cpp
# Opt level: O1

void __thiscall lunasvg::SVGRenderState::beginGroup(SVGRenderState *this,SVGBlendInfo *blendInfo)

{
  Canvas *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  Rect boundingBox;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  plutovg_surface_t *local_58;
  undefined8 uStack_50;
  Rect local_40;
  
  bVar3 = SVGBlendInfo::requiresCompositing(blendInfo,this->m_mode);
  if (bVar3) {
    (*(this->m_element->super_SVGNode)._vptr_SVGNode[0xd])();
    local_40 = Transform::mapRect(&this->m_currentTransform,(Rect *)local_78);
    this_00 = (this->m_canvas).super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    local_58 = (plutovg_surface_t *)CONCAT44((float)this_00->m_y,(float)this_00->m_x);
    uStack_50 = 0;
    iVar4 = Canvas::width(this_00);
    local_68 = ZEXT416((uint)(float)iVar4);
    iVar4 = Canvas::height(this_00);
    local_78._0_8_ = local_58;
    local_78._12_4_ = (float)iVar4;
    local_78._8_4_ = local_68._0_4_;
    local_40 = Rect::intersected(&local_40,(Rect *)local_78);
    Canvas::create((Canvas *)local_78,&local_40);
    uVar2 = local_78._8_8_;
    uVar1 = local_78._0_8_;
    local_78._0_8_ = (plutovg_surface_t *)0x0;
    local_78._8_8_ = (plutovg_canvas_t *)0x0;
    this_01 = (this->m_canvas).super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->m_canvas).super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar1;
    (this->m_canvas).super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    if ((plutovg_canvas_t *)local_78._8_8_ != (plutovg_canvas_t *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
  }
  else {
    Canvas::save((this->m_canvas).super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
  }
  if ((!bVar3) && (blendInfo->m_clipper != (SVGClipPathElement *)0x0)) {
    SVGClipPathElement::applyClipPath(blendInfo->m_clipper,this);
  }
  return;
}

Assistant:

void SVGRenderState::beginGroup(const SVGBlendInfo& blendInfo)
{
    auto requiresCompositing = blendInfo.requiresCompositing(m_mode);
    if(requiresCompositing) {
        auto boundingBox = m_currentTransform.mapRect(m_element->paintBoundingBox());
        boundingBox.intersect(m_canvas->extents());
        m_canvas = Canvas::create(boundingBox);
    } else {
        m_canvas->save();
    }

    if(!requiresCompositing && blendInfo.clipper()) {
        blendInfo.clipper()->applyClipPath(*this);
    }
}